

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O0

void CreateFAPOBase(FAPOBase *fapo,FAPORegistrationProperties *pRegistrationProperties,
                   uint8_t *pParameterBlocks,uint32_t uParameterBlockByteSize,uint8_t fProducer)

{
  uint32_t in_ECX;
  uint8_t *in_RDX;
  FAPORegistrationProperties *in_RSI;
  FAPOBase *in_RDI;
  uint8_t in_R8B;
  
  CreateFAPOBaseWithCustomAllocatorEXT
            (in_RDI,in_RSI,in_RDX,in_ECX,in_R8B,SDL_malloc,SDL_free,SDL_realloc);
  return;
}

Assistant:

void CreateFAPOBase(
	FAPOBase *fapo,
	const FAPORegistrationProperties *pRegistrationProperties,
	uint8_t *pParameterBlocks,
	uint32_t uParameterBlockByteSize,
	uint8_t fProducer
) {
	CreateFAPOBaseWithCustomAllocatorEXT(
		fapo,
		pRegistrationProperties,
		pParameterBlocks,
		uParameterBlockByteSize,
		fProducer,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}